

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O0

void __thiscall CaDiCaL::Internal::rescale_variable_scores(Internal *this)

{
  bool bVar1;
  int *piVar2;
  reference pvVar3;
  long in_RDI;
  int idx_1;
  iterator __end1_1;
  iterator __begin1_1;
  Range *__range1_1;
  double factor;
  double tmp;
  int idx;
  iterator __end1;
  iterator __begin1;
  Range *__range1;
  double divider;
  Range *in_stack_ffffffffffffff98;
  iterator *in_stack_ffffffffffffffa0;
  iterator *this_00;
  iterator local_48;
  iterator local_44;
  long local_40;
  iterator *local_38;
  Internal *local_30;
  int local_24;
  iterator local_20;
  iterator local_1c;
  long local_18;
  Internal *local_10;
  
  *(long *)(in_RDI + 0x11c8) = *(long *)(in_RDI + 0x11c8) + 1;
  local_10 = *(Internal **)(in_RDI + 0x270);
  local_18 = in_RDI + 0x1c68;
  local_1c = Range::begin(in_stack_ffffffffffffff98);
  local_20 = Range::end(in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = CaDiCaL::operator!=(&local_1c,&local_20);
    if (!bVar1) break;
    piVar2 = Range::iterator::operator*(&local_1c);
    local_24 = *piVar2;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2b0),(long)local_24);
    local_30 = (Internal *)*pvVar3;
    if ((double)local_10 < (double)local_30) {
      local_10 = local_30;
    }
    Range::iterator::operator++(in_stack_ffffffffffffffa0);
  }
  if (*(long *)(in_RDI + 0x1c50) != 0) {
    phase(local_10,*(char **)(in_RDI + 0x1c50),0xf1db80,*(char **)(in_RDI + 0x11c8),
          "rescoring %d variable scores by 1/%g",(ulong)*(uint *)(in_RDI + 0x50));
  }
  local_38 = (iterator *)(1.0 / (double)local_10);
  local_40 = in_RDI + 0x1c68;
  local_44 = Range::begin(in_stack_ffffffffffffff98);
  local_48 = Range::end(in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = CaDiCaL::operator!=(&local_44,&local_48);
    if (!bVar1) break;
    piVar2 = Range::iterator::operator*(&local_44);
    this_00 = local_38;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2b0),(long)*piVar2);
    *pvVar3 = (double)this_00 * *pvVar3;
    Range::iterator::operator++(this_00);
  }
  *(double *)(in_RDI + 0x270) = (double)local_38 * *(double *)(in_RDI + 0x270);
  if (*(long *)(in_RDI + 0x1c50) != 0) {
    phase(*(Internal **)(in_RDI + 0x270),*(char **)(in_RDI + 0x1c50),0xf1db80,
          *(char **)(in_RDI + 0x11c8),"new score increment %g after %ld conflicts",
          *(undefined8 *)(in_RDI + 0xf58));
  }
  return;
}

Assistant:

void Internal::rescale_variable_scores () {
  stats.rescored++;
  double divider = score_inc;
  for (auto idx : vars) {
    const double tmp = stab[idx];
    if (tmp > divider)
      divider = tmp;
  }
  PHASE ("rescore", stats.rescored, "rescoring %d variable scores by 1/%g",
         max_var, divider);
  assert (divider > 0);
  double factor = 1.0 / divider;
  for (auto idx : vars)
    stab[idx] *= factor;
  score_inc *= factor;
  PHASE ("rescore", stats.rescored,
         "new score increment %g after %" PRId64 " conflicts", score_inc,
         stats.conflicts);
}